

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevel3DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec3 *coord,IVec4 *result)

{
  Sampler *pSVar1;
  ConstPixelBufferAccess *format;
  int ndx;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int c;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vec2 uBounds;
  Vector<int,_4> res;
  Vector<int,_4> color;
  Vec2 wBounds;
  Vec2 vBounds;
  bool local_b5;
  int local_ac;
  int local_9c;
  undefined4 local_98;
  int local_94;
  int local_90;
  undefined4 local_8c;
  undefined4 local_88;
  int local_84;
  Sampler *local_80;
  ConstPixelBufferAccess *local_78;
  float local_70;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  tcu local_50 [16];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  local_80 = sampler;
  local_78 = access;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(access->m_size).m_data[2],
             coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
  fVar10 = floorf(local_70);
  fVar11 = floorf(local_6c);
  fVar12 = floorf(local_38);
  fVar13 = floorf(local_34);
  fVar14 = floorf(local_40);
  local_9c = (int)fVar14;
  fVar14 = floorf(local_3c);
  format = local_78;
  pSVar1 = local_80;
  local_84 = (int)fVar14;
  local_b5 = local_9c <= local_84;
  if (local_9c <= local_84) {
    local_90 = (int)fVar10;
    iVar8 = (int)fVar13;
    local_b5 = true;
    local_94 = (int)fVar12;
    do {
      if (local_94 <= iVar8) {
        local_ac = local_94;
        iVar2 = (int)fVar12;
        do {
          for (c = local_90; c <= (int)fVar11; c = c + 1) {
            iVar3 = TexVerifierUtil::wrap(pSVar1->wrapS,c,(format->m_size).m_data[0]);
            iVar4 = TexVerifierUtil::wrap(pSVar1->wrapT,local_ac,(format->m_size).m_data[1]);
            iVar5 = TexVerifierUtil::wrap(pSVar1->wrapR,local_9c,(format->m_size).m_data[2]);
            if ((((iVar3 < 0) || ((format->m_size).m_data[0] <= iVar3)) || (iVar4 < 0)) ||
               ((((format->m_size).m_data[1] <= iVar4 || (iVar5 < 0)) ||
                ((format->m_size).m_data[2] <= iVar5)))) {
              sampleTextureBorder<int>(local_50,&format->m_format,local_80);
            }
            else {
              ConstPixelBufferAccess::getPixelT<int>
                        ((ConstPixelBufferAccess *)local_50,(int)format,iVar3,iVar4);
            }
            local_68 = 0;
            uStack_60 = 0;
            lVar6 = 0;
            do {
              iVar3 = *(int *)(local_50 + lVar6 * 4);
              iVar4 = result->m_data[lVar6];
              iVar5 = iVar3 - iVar4;
              if (iVar3 - iVar4 == 0 || iVar3 < iVar4) {
                iVar5 = -(iVar3 - iVar4);
              }
              *(int *)((long)&local_68 + lVar6 * 4) = iVar5;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            local_88 = 0;
            lVar6 = 0;
            do {
              *(bool *)((long)&local_88 + lVar6) =
                   *(uint *)((long)&local_68 + lVar6 * 4) <= (prec->colorThreshold).m_data[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            local_8c = 0;
            lVar6 = 0;
            do {
              *(byte *)((long)&local_8c + lVar6) = (prec->colorMask).m_data[lVar6] ^ 1;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            local_98 = 0;
            lVar6 = 0;
            do {
              *(byte *)((long)&local_98 + lVar6) =
                   *(byte *)((long)&local_8c + lVar6) | *(byte *)((long)&local_88 + lVar6);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            if ((char)local_98 != '\0') {
              uVar7 = 0xffffffffffffffff;
              do {
                if (uVar7 == 2) {
                  uVar9 = 3;
                  break;
                }
                uVar9 = uVar7 + 1;
                lVar6 = uVar7 + 2;
                uVar7 = uVar9;
              } while (*(char *)((long)&local_98 + lVar6) != '\0');
              if (2 < uVar9) {
                if (iVar2 <= iVar8) {
                  return local_b5;
                }
                goto LAB_019fb1bc;
              }
            }
          }
          local_ac = local_ac + 1;
          iVar2 = local_ac;
        } while (local_ac <= iVar8);
      }
LAB_019fb1bc:
      local_9c = local_9c + 1;
      local_b5 = local_9c <= local_84;
    } while (local_9c <= local_84);
  }
  return local_b5;
}

Assistant:

bool isLevel3DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, result);
}